

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::AnnotatedHandler::decode
          (AnnotatedHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Reader value;
  Reader value_00;
  Reader *pRVar1;
  RemoveConst<capnp::json::Value::Field::Reader> *pRVar2;
  RemoveConst<capnp::json::Value::Field::Reader> *pRVar3;
  undefined4 uVar4;
  SegmentReader *pSVar5;
  CapTableReader *pCVar6;
  bool bVar7;
  Reader *__begin3;
  SegmentReader *pSVar8;
  Reader *__end3;
  StringPtr SVar9;
  DebugExpression<bool> _kjCondition;
  Reader field;
  HashSet<const_void_*> unionsSeen;
  ArrayBuilder<capnp::json::Value::Field::Reader> local_178;
  AnnotatedHandler *local_158;
  JsonCodec *local_150;
  undefined1 local_148 [40];
  Arena *pAStack_120;
  IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
  local_118;
  Reader local_108;
  HashSet<const_void_*> local_d8;
  Reader local_90;
  Reader local_60;
  
  local_158 = this;
  local_150 = codec;
  if (input._reader.dataSize < 0x10) {
    local_148._0_8_ = (ulong)(uint7)local_148._1_7_ << 8;
  }
  else {
    local_148[0] = *input._reader.data == 5;
    if (*input._reader.data == 5) {
      local_d8.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .rows.builder.ptr = (Entry *)0x0;
      local_d8.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .rows.builder.pos =
           (RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)0x0;
      local_d8.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .rows.builder.endPtr = (Entry *)0x0;
      local_d8.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .rows.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
      local_d8.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .indexes.erasedCount = 0;
      local_d8.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .indexes.buckets.ptr = (HashBucket *)0x0;
      local_d8.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .indexes.buckets.size_ = 0;
      local_d8.
      super_Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
      .indexes.buckets.disposer = (ArrayDisposer *)0x0;
      local_178.ptr = (Reader *)0x0;
      local_178.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
      local_178.endPtr = (Reader *)0x0;
      local_178.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
      capnp::json::Value::Reader::getObject((Reader *)local_148,&input);
      uVar4 = local_148._24_4_;
      local_118.container = (Reader *)local_148;
      for (local_118.index = 0; local_118.index != uVar4; local_118.index = local_118.index + 1) {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
        ::operator*(&local_108,&local_118);
        SVar9.content = (ArrayPtr<const_char>)capnp::json::Value::Field::Reader::getName(&local_108)
        ;
        capnp::json::Value::Field::Reader::getValue(&local_60,&local_108);
        value._reader.capTable = local_60._reader.capTable;
        value._reader.segment = local_60._reader.segment;
        value._reader.data = local_60._reader.data;
        value._reader.pointers = local_60._reader.pointers;
        value._reader.dataSize = local_60._reader.dataSize;
        value._reader.pointerCount = local_60._reader.pointerCount;
        value._reader._38_2_ = local_60._reader._38_2_;
        value._reader.nestingLimit = local_60._reader.nestingLimit;
        value._reader._44_4_ = local_60._reader._44_4_;
        bVar7 = decodeField(local_158,local_150,SVar9,value,output,&local_d8);
        if (!bVar7) {
          kj::Vector<capnp::json::Value::Field::Reader>::add<capnp::json::Value::Field::Reader&>
                    ((Vector<capnp::json::Value::Field::Reader> *)&local_178,&local_108);
        }
      }
      do {
        pRVar2 = local_178.pos;
        pSVar8 = (SegmentReader *)local_178.ptr;
        if (local_178.pos == local_178.ptr) break;
        local_108._reader.segment = (SegmentReader *)local_178.ptr;
        local_108._reader.capTable = (CapTableReader *)local_178.pos;
        local_108._reader.data = local_178.endPtr;
        local_108._reader.pointers = (WirePointer *)local_178.disposer;
        local_178.ptr = (Reader *)0x0;
        local_178.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
        local_178.endPtr = (Reader *)0x0;
        for (; pCVar6 = local_108._reader.capTable, pSVar5 = local_108._reader.segment,
            pRVar3 = local_178.pos, pRVar1 = local_178.ptr, pSVar8 != (SegmentReader *)pRVar2;
            pSVar8 = (SegmentReader *)&pSVar8[1].id) {
          local_148._0_8_ = pSVar8->arena;
          local_148._8_8_ = *(undefined8 *)&pSVar8->id;
          local_148._16_8_ = (pSVar8->ptr).ptr;
          local_148._24_8_ = (pSVar8->ptr).size_;
          local_148._32_8_ = pSVar8->readLimiter;
          pAStack_120 = pSVar8[1].arena;
          SVar9.content =
               (ArrayPtr<const_char>)capnp::json::Value::Field::Reader::getName((Reader *)local_148)
          ;
          capnp::json::Value::Field::Reader::getValue(&local_90,(Reader *)local_148);
          value_00._reader.capTable = local_90._reader.capTable;
          value_00._reader.segment = local_90._reader.segment;
          value_00._reader.data = local_90._reader.data;
          value_00._reader.pointers = local_90._reader.pointers;
          value_00._reader.dataSize = local_90._reader.dataSize;
          value_00._reader.pointerCount = local_90._reader.pointerCount;
          value_00._reader._38_2_ = local_90._reader._38_2_;
          value_00._reader.nestingLimit = local_90._reader.nestingLimit;
          value_00._reader._44_4_ = local_90._reader._44_4_;
          bVar7 = decodeField(local_158,local_150,SVar9,value_00,output,&local_d8);
          if (!bVar7) {
            kj::Vector<capnp::json::Value::Field::Reader>::add<capnp::json::Value::Field::Reader&>
                      ((Vector<capnp::json::Value::Field::Reader> *)&local_178,(Reader *)local_148);
          }
        }
        kj::ArrayBuilder<capnp::json::Value::Field::Reader>::dispose
                  ((ArrayBuilder<capnp::json::Value::Field::Reader> *)&local_108);
      } while ((long)pRVar3 - (long)pRVar1 != (long)pCVar6 - (long)pSVar5);
      kj::ArrayBuilder<capnp::json::Value::Field::Reader>::dispose(&local_178);
      kj::Table<const_void_*,_kj::HashIndex<kj::_::HashSetCallbacks>_>::~Table
                ((Table<const_void_*,_kj::HashIndex<kj::_::HashSetCallbacks>_> *)&local_d8);
      return;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x47e,FAILED,"input.isObject()","_kjCondition,",(DebugExpression<bool> *)local_148);
  kj::_::Debug::Fault::fatal((Fault *)&local_d8);
}

Assistant:

void decode(const JsonCodec& codec, JsonValue::Reader input,
              DynamicStruct::Builder output) const override {
    KJ_REQUIRE(input.isObject());
    kj::HashSet<const void*> unionsSeen;
    kj::Vector<JsonValue::Field::Reader> retries;
    for (auto field: input.getObject()) {
      if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
        retries.add(field);
      }
    }
    while (!retries.empty()) {
      auto retriesCopy = kj::mv(retries);
      KJ_ASSERT(retries.empty());
      for (auto field: retriesCopy) {
        if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
          retries.add(field);
        }
      }
      if (retries.size() == retriesCopy.size()) {
        // We made no progress in this iteration. Give up on the remaining fields.
        break;
      }
    }
  }